

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O0

double flatbuffers::GetAnyValueF(BaseType type,uint8_t *data)

{
  uint uVar1;
  char *s_00;
  int64_t iVar2;
  float fVar3;
  double local_30;
  double d;
  String *s;
  uint8_t *data_local;
  double dStack_10;
  BaseType type_local;
  
  s = (String *)data;
  data_local._4_4_ = type;
  if (type == Float) {
    fVar3 = ReadScalar<float>(data);
    dStack_10 = (double)fVar3;
  }
  else if (type == Double) {
    dStack_10 = ReadScalar<double>(data);
  }
  else if (type == String) {
    uVar1 = ReadScalar<unsigned_int>(data);
    d = (double)(&s->super_Vector<char,_unsigned_int> + uVar1);
    if ((Vector<char,_unsigned_int> *)d == (Vector<char,_unsigned_int> *)0x0) {
      dStack_10 = 0.0;
    }
    else {
      s_00 = String::c_str((String *)d);
      StringToNumber<double>(s_00,&local_30);
      dStack_10 = local_30;
    }
  }
  else {
    iVar2 = GetAnyValueI(type,data);
    dStack_10 = (double)iVar2;
  }
  return dStack_10;
}

Assistant:

double GetAnyValueF(reflection::BaseType type, const uint8_t *data) {
  switch (type) {
    case reflection::Float: return static_cast<double>(ReadScalar<float>(data));
    case reflection::Double: return ReadScalar<double>(data);
    case reflection::String: {
      auto s =
          reinterpret_cast<const String *>(ReadScalar<uoffset_t>(data) + data);
      if (s) {
        double d;
        StringToNumber(s->c_str(), &d);
        return d;
      } else {
        return 0.0;
      }
    }
    default: return static_cast<double>(GetAnyValueI(type, data));
  }
}